

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor_tests.cpp
# Opt level: O2

void check_csv_cursor_table<jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>>
               (string *info,
               basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *cursor,
               string *expected_key,uint expected_value)

{
  Flags FVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  staj_event_type local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  AssertionHandler catchAssertionHandler;
  uint expected_value_local;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage scopedMessage31;
  
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6579d8;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3e4;
  expected_value_local = expected_value;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,(StringRef *)&local_228,
             (SourceLineInfo *)&local_1f8,Info);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,(string *)info);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage31,(MessageBuilder *)&catchAssertionHandler);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x657758;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3e6;
  Catch::StringRef::StringRef(&local_120,"cursor.done()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_120,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 999;
  Catch::StringRef::StringRef
            (&local_90,"staj_event_type::begin_array == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_90,
             Normal);
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  local_230._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0xe;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3e9;
  Catch::StringRef::StringRef(&local_130,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_130,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3eb;
  Catch::StringRef::StringRef
            (&local_a0,"staj_event_type::begin_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_a0,
             Normal);
  local_230._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0xd;
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var_00,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3ed;
  Catch::StringRef::StringRef(&local_140,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_140,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3ef;
  Catch::StringRef::StringRef(&local_b0,"staj_event_type::key == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_b0,
             Normal);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)local_230._1_7_ << 8);
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var_01,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f0;
  Catch::StringRef::StringRef
            (&local_c0,"cursor.current().template get<std::string>() == expected_key");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_c0,
             ContinueOnFailure);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            (&local_1f8,(basic_staj_event<char> *)CONCAT44(extraout_var_02,iVar2));
  local_230 = &local_1f8;
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (&local_228,(ExprLhs<std::__cxx11::string_const&> *)&local_230,expected_key);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  std::__cxx11::string::~string((string *)&local_1f8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f2;
  Catch::StringRef::StringRef(&local_150,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_150,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f4;
  Catch::StringRef::StringRef
            (&local_d0,"staj_event_type::uint64_value == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_d0,
             Normal);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(local_230._1_7_,6);
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var_03,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f5;
  Catch::StringRef::StringRef
            (&local_e0,"cursor.current().template get<unsigned>() == expected_value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_e0,
             ContinueOnFailure);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  uVar3 = jsoncons::basic_staj_event<char>::get<unsigned_int>
                    ((basic_staj_event<char> *)CONCAT44(extraout_var_04,iVar2));
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_230._4_4_,uVar3);
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  Catch::ExprLhs<unsigned_int_const&>::operator==
            ((BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *)&local_228,
             (ExprLhs<unsigned_int_const&> *)&local_1f8,&expected_value_local);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f7;
  Catch::StringRef::StringRef(&local_160,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_160,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3f9;
  Catch::StringRef::StringRef
            (&local_f0,"staj_event_type::end_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_f0,
             Normal);
  local_230._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0x7;
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var_05,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3fb;
  Catch::StringRef::StringRef(&local_170,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_170,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x3fd;
  Catch::StringRef::StringRef
            (&local_100,"staj_event_type::end_array == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_100,
             Normal);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(local_230._1_7_,0xf);
  local_1f8._M_dataplus._M_p = (pointer)&local_230;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_231 = *(staj_event_type *)CONCAT44(extraout_var_06,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_228,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_1f8,&local_231);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_228.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_228.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_228.super_ITransientExpression.m_isBinaryExpression = true;
  local_228.super_ITransientExpression.m_result = false;
  local_228.super_ITransientExpression._10_6_ = 0;
  local_1f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_1f8._M_string_length = 0x400;
  Catch::StringRef::StringRef(&local_110,"cursor.done()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_228,(SourceLineInfo *)&local_1f8,local_110,
             ContinueOnFailure);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_228.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_228.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage31);
  return;
}

Assistant:

void check_csv_cursor_table(std::string info, CursorType& cursor,
                            std::string expected_key, unsigned expected_value)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    REQUIRE(staj_event_type::begin_array == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::begin_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::key == cursor.current().event_type());
    CHECK(cursor.current().template get<std::string>() == expected_key);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::uint64_value == cursor.current().event_type());
    CHECK(cursor.current().template get<unsigned>() == expected_value);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_array == cursor.current().event_type());

    cursor.next();
    CHECK(cursor.done());
}